

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ahrens_beylkin.hpp
# Opt level: O0

tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
* IntegratorXX::quadrature_traits<IntegratorXX::AhrensBeylkin<double>,_void>::generate
            (tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
             *__return_storage_ptr__,size_t npts)

{
  pointer __n;
  allocator<double> local_61;
  undefined1 local_60 [8];
  weight_container weights;
  allocator<std::array<double,_3UL>_> local_31;
  undefined1 local_30 [8];
  point_container points;
  size_t npts_local;
  
  points.super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)npts;
  std::allocator<std::array<double,_3UL>_>::allocator(&local_31);
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
            ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)local_30,
             npts,&local_31);
  std::allocator<std::array<double,_3UL>_>::~allocator(&local_31);
  __n = points.
        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<double>::allocator(&local_61);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_60,(size_type)__n,&local_61);
  std::allocator<double>::~allocator(&local_61);
  if (points.super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x48) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_72<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x84) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_132<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xc0) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_192<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x138) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_312<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x174) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_372<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x1b0) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_432<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x1ec) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_492<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x228) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_552<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x264) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_612<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x2a0) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_672<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x2dc) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_732<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x318) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_792<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x390) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_912<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x3cc) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_972<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x408) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_1032<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x444) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_1092<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x4f8) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_1272<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x534) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_1332<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x570) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_1392<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x5e8) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_1512<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x624) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_1572<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x660) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_1632<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x69c) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_1692<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x714) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_1812<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x78c) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_1932<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x7c8) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_1992<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x840) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_2112<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x87c) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_2172<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x8b8) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_2232<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x8f4) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_2292<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x96c) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_2412<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x9a8) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_2472<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xa98) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_2712<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xad4) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_2772<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xb10) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_2832<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xbc4) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_3012<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xcf0) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_3312<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xd2c) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_3372<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xd68) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_3432<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xda4) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_3492<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xe1c) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_3612<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0xed0) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_3792<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x1074) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_4212<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x10ec) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_4332<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x11dc) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_4572<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x1254) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_4692<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x1380) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_4992<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x1470) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_5232<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x1560) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_5472<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x15d8) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_5592<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x168c) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_5772<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x1830) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_6192<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x18a8) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_6312<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x1b00) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_6912<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x1d58) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_7512<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  else if (points.
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x3aa4) {
    detail::
    copy_grid<IntegratorXX::AhrensBeylkinGrids::ahrens_beylkin_15012<double>,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)
               local_30,(vector<double,_std::allocator<double>_> *)local_60);
  }
  std::
  make_tuple<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>&,std::vector<double,std::allocator<double>>&>
            (__return_storage_ptr__,
             (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)local_30,
             (vector<double,_std::allocator<double>_> *)local_60);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::~vector
            ((vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *)local_30)
  ;
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container, weight_container>
  generate(size_t npts) {

    point_container points(npts);
    weight_container weights(npts);

    using namespace AhrensBeylkinGrids;

    if (npts == 72)
      detail::copy_grid<ahrens_beylkin_72<RealType>>(points, weights);
    else if (npts == 132)
      detail::copy_grid<ahrens_beylkin_132<RealType>>(points, weights);
    else if (npts == 192)
      detail::copy_grid<ahrens_beylkin_192<RealType>>(points, weights);
    else if (npts == 312)
      detail::copy_grid<ahrens_beylkin_312<RealType>>(points, weights);
    else if (npts == 372)
      detail::copy_grid<ahrens_beylkin_372<RealType>>(points, weights);
    else if (npts == 432)
      detail::copy_grid<ahrens_beylkin_432<RealType>>(points, weights);
    else if (npts == 492)
      detail::copy_grid<ahrens_beylkin_492<RealType>>(points, weights);
    else if (npts == 552)
      detail::copy_grid<ahrens_beylkin_552<RealType>>(points, weights);
    else if (npts == 612)
      detail::copy_grid<ahrens_beylkin_612<RealType>>(points, weights);
    else if (npts == 672)
      detail::copy_grid<ahrens_beylkin_672<RealType>>(points, weights);
    else if (npts == 732)
      detail::copy_grid<ahrens_beylkin_732<RealType>>(points, weights);
    else if (npts == 792)
      detail::copy_grid<ahrens_beylkin_792<RealType>>(points, weights);
    else if (npts == 912)
      detail::copy_grid<ahrens_beylkin_912<RealType>>(points, weights);
    else if (npts == 972)
      detail::copy_grid<ahrens_beylkin_972<RealType>>(points, weights);
    else if (npts == 1032)
      detail::copy_grid<ahrens_beylkin_1032<RealType>>(points, weights);
    else if (npts == 1092)
      detail::copy_grid<ahrens_beylkin_1092<RealType>>(points, weights);
    else if (npts == 1272)
      detail::copy_grid<ahrens_beylkin_1272<RealType>>(points, weights);
    else if (npts == 1332)
      detail::copy_grid<ahrens_beylkin_1332<RealType>>(points, weights);
    else if (npts == 1392)
      detail::copy_grid<ahrens_beylkin_1392<RealType>>(points, weights);
    else if (npts == 1512)
      detail::copy_grid<ahrens_beylkin_1512<RealType>>(points, weights);
    else if (npts == 1572)
      detail::copy_grid<ahrens_beylkin_1572<RealType>>(points, weights);
    else if (npts == 1632)
      detail::copy_grid<ahrens_beylkin_1632<RealType>>(points, weights);
    else if (npts == 1692)
      detail::copy_grid<ahrens_beylkin_1692<RealType>>(points, weights);
    else if (npts == 1812)
      detail::copy_grid<ahrens_beylkin_1812<RealType>>(points, weights);
    else if (npts == 1932)
      detail::copy_grid<ahrens_beylkin_1932<RealType>>(points, weights);
    else if (npts == 1992)
      detail::copy_grid<ahrens_beylkin_1992<RealType>>(points, weights);
    else if (npts == 2112)
      detail::copy_grid<ahrens_beylkin_2112<RealType>>(points, weights);
    else if (npts == 2172)
      detail::copy_grid<ahrens_beylkin_2172<RealType>>(points, weights);
    else if (npts == 2232)
      detail::copy_grid<ahrens_beylkin_2232<RealType>>(points, weights);
    else if (npts == 2292)
      detail::copy_grid<ahrens_beylkin_2292<RealType>>(points, weights);
    else if (npts == 2412)
      detail::copy_grid<ahrens_beylkin_2412<RealType>>(points, weights);
    else if (npts == 2472)
      detail::copy_grid<ahrens_beylkin_2472<RealType>>(points, weights);
    else if (npts == 2712)
      detail::copy_grid<ahrens_beylkin_2712<RealType>>(points, weights);
    else if (npts == 2772)
      detail::copy_grid<ahrens_beylkin_2772<RealType>>(points, weights);
    else if (npts == 2832)
      detail::copy_grid<ahrens_beylkin_2832<RealType>>(points, weights);
    else if (npts == 3012)
      detail::copy_grid<ahrens_beylkin_3012<RealType>>(points, weights);
    else if (npts == 3312)
      detail::copy_grid<ahrens_beylkin_3312<RealType>>(points, weights);
    else if (npts == 3372)
      detail::copy_grid<ahrens_beylkin_3372<RealType>>(points, weights);
    else if (npts == 3432)
      detail::copy_grid<ahrens_beylkin_3432<RealType>>(points, weights);
    else if (npts == 3492)
      detail::copy_grid<ahrens_beylkin_3492<RealType>>(points, weights);
    else if (npts == 3612)
      detail::copy_grid<ahrens_beylkin_3612<RealType>>(points, weights);
    else if (npts == 3792)
      detail::copy_grid<ahrens_beylkin_3792<RealType>>(points, weights);
    else if (npts == 4212)
      detail::copy_grid<ahrens_beylkin_4212<RealType>>(points, weights);
    else if (npts == 4332)
      detail::copy_grid<ahrens_beylkin_4332<RealType>>(points, weights);
    else if (npts == 4572)
      detail::copy_grid<ahrens_beylkin_4572<RealType>>(points, weights);
    else if (npts == 4692)
      detail::copy_grid<ahrens_beylkin_4692<RealType>>(points, weights);
    else if (npts == 4992)
      detail::copy_grid<ahrens_beylkin_4992<RealType>>(points, weights);
    else if (npts == 5232)
      detail::copy_grid<ahrens_beylkin_5232<RealType>>(points, weights);
    else if (npts == 5472)
      detail::copy_grid<ahrens_beylkin_5472<RealType>>(points, weights);
    else if (npts == 5592)
      detail::copy_grid<ahrens_beylkin_5592<RealType>>(points, weights);
    else if (npts == 5772)
      detail::copy_grid<ahrens_beylkin_5772<RealType>>(points, weights);
    else if (npts == 6192)
      detail::copy_grid<ahrens_beylkin_6192<RealType>>(points, weights);
    else if (npts == 6312)
      detail::copy_grid<ahrens_beylkin_6312<RealType>>(points, weights);
    else if (npts == 6912)
      detail::copy_grid<ahrens_beylkin_6912<RealType>>(points, weights);
    else if (npts == 7512)
      detail::copy_grid<ahrens_beylkin_7512<RealType>>(points, weights);
    else if (npts == 15012)
      detail::copy_grid<ahrens_beylkin_15012<RealType>>(points, weights);

    return std::make_tuple(points, weights);
  }